

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::Parse
          (AsciiParser *this,uint32_t load_states,AsciiParserOption *parser_option)

{
  bool bVar1;
  ostream *poVar2;
  long primIdx_00;
  string local_c10;
  ostringstream local_bf0 [8];
  ostringstream ss_e_5;
  bool block_ok;
  int64_t primIdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a28;
  ostringstream local_a08 [8];
  ostringstream ss_e_4;
  Specifier local_890;
  Specifier spec;
  ostringstream local_868 [8];
  ostringstream ss_e_3;
  undefined1 local_6f0 [8];
  Identifier tok;
  uint64_t curr_loc;
  string local_6c0;
  string local_6a0;
  ostringstream local_680 [8];
  ostringstream ss_w;
  string local_508;
  ostringstream local_4e8 [8];
  ostringstream ss_e_2;
  undefined1 local_368 [7];
  bool ret;
  ostringstream local_348 [8];
  ostringstream ss_e_1;
  char local_1c9;
  undefined1 local_1c8 [7];
  char c;
  ostringstream local_1a8 [8];
  ostringstream ss_e;
  bool header_ok;
  AsciiParserOption *parser_option_local;
  uint32_t load_states_local;
  AsciiParser *this_local;
  
  this->_toplevel = (load_states & 1) != 0;
  this->_sub_layered = (load_states & 2) != 0;
  this->_referenced = (load_states & 4) != 0;
  this->_payloaded = (load_states & 8) != 0;
  bVar1 = parser_option->allow_unknown_apiSchema;
  (this->_option).allow_unknown_prim = parser_option->allow_unknown_prim;
  (this->_option).allow_unknown_apiSchema = bVar1;
  (this->_option).strict_allowedToken_check = parser_option->strict_allowedToken_check;
  bVar1 = ParseMagicHeader(this);
  if (bVar1) {
    SkipCommentAndWhitespaceAndNewline(this,true);
    bVar1 = Eof(this);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
      bVar1 = LookChar1(this,&local_1c9);
      if (bVar1) {
        if ((local_1c9 != '(') || (bVar1 = ParseStageMetas(this), bVar1)) {
          bVar1 = ::std::function::operator_cast_to_bool((function *)&this->_stage_meta_process_fun)
          ;
          if (bVar1) {
            bVar1 = ::std::function<bool_(const_tinyusdz::ascii::AsciiParser::StageMetas_&)>::
                    operator()(&this->_stage_meta_process_fun,&this->_stage_metas);
            if (!bVar1) {
              ::std::__cxx11::ostringstream::ostringstream(local_4e8);
              poVar2 = ::std::operator<<((ostream *)local_4e8,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"Parse");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x142a);
              ::std::operator<<(poVar2," ");
              poVar2 = ::std::operator<<((ostream *)local_4e8,"Failed to reconstruct Stage metas.");
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_508);
              ::std::__cxx11::string::~string((string *)&local_508);
              this_local._7_1_ = 0;
              ::std::__cxx11::ostringstream::~ostringstream(local_4e8);
              goto LAB_005111b2;
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_680);
            poVar2 = ::std::operator<<((ostream *)local_680,"[warn]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"Parse");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x142e);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_680,
                                       "Stage metadata processing callback is not set.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::ostringstream::str();
            PushWarn(this,&local_6a0);
            ::std::__cxx11::string::~string((string *)&local_6a0);
            ::std::__cxx11::ostringstream::~ostringstream(local_680);
          }
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_6c0,"/",(allocator *)((long)&curr_loc + 7));
          PushPrimPath(this,&local_6c0);
          ::std::__cxx11::string::~string((string *)&local_6c0);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&curr_loc + 7));
          do {
            bVar1 = Eof(this);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_005111ae:
              this_local._7_1_ = 1;
              break;
            }
            bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
            if (!bVar1) {
              this_local._7_1_ = 0;
              break;
            }
            bVar1 = Eof(this);
            if (bVar1) goto LAB_005111ae;
            tok.super_string.field_2._8_8_ = StreamReader::tell(this->_sr);
            Identifier::Identifier((Identifier *)local_6f0);
            bVar1 = ReadBasicType(this,(Identifier *)local_6f0);
            if (bVar1) {
              bVar1 = SeekTo(this,tok.super_string.field_2._8_8_);
              if (bVar1) {
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_6f0,"def");
                if (bVar1) {
                  local_890 = Def;
                }
                else {
                  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_6f0,"over");
                  if (bVar1) {
                    local_890 = Over;
                  }
                  else {
                    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_6f0,"class");
                    if (!bVar1) {
                      ::std::__cxx11::ostringstream::ostringstream(local_a08);
                      poVar2 = ::std::operator<<((ostream *)local_a08,"[error]");
                      poVar2 = ::std::operator<<(poVar2,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                );
                      poVar2 = ::std::operator<<(poVar2,":");
                      poVar2 = ::std::operator<<(poVar2,"Parse");
                      poVar2 = ::std::operator<<(poVar2,"():");
                      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1453);
                      ::std::operator<<(poVar2," ");
                      ::std::operator+(&local_a48,"Invalid specifier token \'",
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_6f0);
                      ::std::operator+(&local_a28,&local_a48,"\'");
                      poVar2 = ::std::operator<<((ostream *)local_a08,(string *)&local_a28);
                      ::std::operator<<(poVar2,"\n");
                      ::std::__cxx11::string::~string((string *)&local_a28);
                      ::std::__cxx11::string::~string((string *)&local_a48);
                      ::std::__cxx11::ostringstream::str();
                      PushError(this,(string *)&primIdx);
                      ::std::__cxx11::string::~string((string *)&primIdx);
                      this_local._7_1_ = 0;
                      bVar1 = true;
                      ::std::__cxx11::ostringstream::~ostringstream(local_a08);
                      goto LAB_0051118f;
                    }
                    local_890 = Class;
                  }
                }
                primIdx_00 = ::std::function<long_(long)>::operator()
                                       (&this->_prim_idx_assign_fun,-1);
                bVar1 = ParseBlock(this,local_890,primIdx_00,-1,0,false);
                if (bVar1) {
                  bVar1 = false;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_bf0);
                  poVar2 = ::std::operator<<((ostream *)local_bf0,"[error]");
                  poVar2 = ::std::operator<<(poVar2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                            );
                  poVar2 = ::std::operator<<(poVar2,":");
                  poVar2 = ::std::operator<<(poVar2,"Parse");
                  poVar2 = ::std::operator<<(poVar2,"():");
                  poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x145c);
                  ::std::operator<<(poVar2," ");
                  poVar2 = ::std::operator<<((ostream *)local_bf0,"Failed to parse `def` block.");
                  ::std::operator<<(poVar2,"\n");
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,&local_c10);
                  ::std::__cxx11::string::~string((string *)&local_c10);
                  this_local._7_1_ = 0;
                  bVar1 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_bf0);
                }
              }
              else {
                this_local._7_1_ = 0;
                bVar1 = true;
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_868);
              poVar2 = ::std::operator<<((ostream *)local_868,"[error]");
              poVar2 = ::std::operator<<(poVar2,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar2 = ::std::operator<<(poVar2,":");
              poVar2 = ::std::operator<<(poVar2,"Parse");
              poVar2 = ::std::operator<<(poVar2,"():");
              poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1443);
              ::std::operator<<(poVar2," ");
              poVar2 = ::std::operator<<((ostream *)local_868,"Identifier expected.\n");
              ::std::operator<<(poVar2,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,(string *)&spec);
              ::std::__cxx11::string::~string((string *)&spec);
              this_local._7_1_ = 0;
              bVar1 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_868);
            }
LAB_0051118f:
            Identifier::~Identifier((Identifier *)local_6f0);
          } while (!bVar1);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_348);
          poVar2 = ::std::operator<<((ostream *)local_348,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"Parse");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x1421);
          ::std::operator<<(poVar2," ");
          poVar2 = ::std::operator<<((ostream *)local_348,"Failed to parse Stage metas.");
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)local_368);
          ::std::__cxx11::string::~string((string *)local_368);
          this_local._7_1_ = 0;
          ::std::__cxx11::ostringstream::~ostringstream(local_348);
        }
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"Parse");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x140e);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a8,"Failed to parse USDA magic header.\n");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)local_1c8);
    ::std::__cxx11::string::~string((string *)local_1c8);
    this_local._7_1_ = 0;
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
LAB_005111b2:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::Parse(const uint32_t load_states,
                        const AsciiParserOption &parser_option) {
  _toplevel = (load_states & static_cast<uint32_t>(LoadState::Toplevel));
  _sub_layered = (load_states & static_cast<uint32_t>(LoadState::Sublayer));
  _referenced = (load_states & static_cast<uint32_t>(LoadState::Reference));
  _payloaded = (load_states & static_cast<uint32_t>(LoadState::Payload));
  _option = parser_option;

  bool header_ok = ParseMagicHeader();
  if (!header_ok) {
    PUSH_ERROR_AND_RETURN("Failed to parse USDA magic header.\n");
  }

  SkipCommentAndWhitespaceAndNewline();

  if (Eof()) {
    // Empty USDA
    return true;
  }

  {
    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == '(') {
      // stage meta.
      if (!ParseStageMetas()) {
        PUSH_ERROR_AND_RETURN("Failed to parse Stage metas.");
      }
    }
  }

  if (_stage_meta_process_fun) {
    DCOUT("Invoke StageMeta callback.");
    bool ret = _stage_meta_process_fun(_stage_metas);
    if (!ret) {
      PUSH_ERROR_AND_RETURN("Failed to reconstruct Stage metas.");
    }
  } else {
    // TODO: Report error when StageMeta callback is not set?
    PUSH_WARN("Stage metadata processing callback is not set.");
  }

  PushPrimPath("/");

  // parse blocks
  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    if (Eof()) {
      // Whitespaces in the end of line.
      break;
    }

    // Look ahead token
    auto curr_loc = _sr->tell();

    Identifier tok;
    if (!ReadBasicType(&tok)) {
      PUSH_ERROR_AND_RETURN("Identifier expected.\n");
    }

    // Rewind
    if (!SeekTo(curr_loc)) {
      return false;
    }

    Specifier spec{Specifier::Invalid};
    if (tok == "def") {
      spec = Specifier::Def;
    } else if (tok == "over") {
      spec = Specifier::Over;
    } else if (tok == "class") {
      spec = Specifier::Class;
    } else {
      PUSH_ERROR_AND_RETURN("Invalid specifier token '" + tok + "'");
    }

    int64_t primIdx = _prim_idx_assign_fun(-1);
    DCOUT("Enter parseDef. primIdx = " << primIdx
                                       << ", parentPrimIdx = root(-1)");
    bool block_ok = ParseBlock(spec, primIdx, /* parent */ -1, /* depth */ 0,
                               /* in_variantStmt */ false);
    if (!block_ok) {
      PUSH_ERROR_AND_RETURN("Failed to parse `def` block.");
    }
  }

  return true;
}